

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

uint32_t spvtools::opt::anon_unknown_0::GetArrayLength
                   (DefUseManager *def_use_mgr,Instruction *array_type)

{
  Op OVar1;
  uint32_t uVar2;
  Instruction *this;
  Instruction *array_length_inst;
  uint32_t const_int_id;
  Instruction *array_type_local;
  DefUseManager *def_use_mgr_local;
  
  OVar1 = opt::Instruction::opcode(array_type);
  if (OVar1 != OpTypeArray) {
    __assert_fail("array_type->opcode() == spv::Op::OpTypeArray",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                  ,0x2b,
                  "uint32_t spvtools::opt::(anonymous namespace)::GetArrayLength(analysis::DefUseManager *, Instruction *)"
                 );
  }
  uVar2 = opt::Instruction::GetSingleWordInOperand(array_type,1);
  this = analysis::DefUseManager::GetDef(def_use_mgr,uVar2);
  OVar1 = opt::Instruction::opcode(this);
  if (OVar1 == OpConstant) {
    uVar2 = opt::Instruction::GetSingleWordInOperand(this,0);
    return uVar2;
  }
  __assert_fail("array_length_inst->opcode() == spv::Op::OpConstant",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                ,0x2f,
                "uint32_t spvtools::opt::(anonymous namespace)::GetArrayLength(analysis::DefUseManager *, Instruction *)"
               );
}

Assistant:

uint32_t GetArrayLength(analysis::DefUseManager* def_use_mgr,
                        Instruction* array_type) {
  assert(array_type->opcode() == spv::Op::OpTypeArray);
  uint32_t const_int_id =
      array_type->GetSingleWordInOperand(kOpTypeArrayLengthInOperandIndex);
  Instruction* array_length_inst = def_use_mgr->GetDef(const_int_id);
  assert(array_length_inst->opcode() == spv::Op::OpConstant);
  return array_length_inst->GetSingleWordInOperand(
      kOpConstantValueInOperandIndex);
}